

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O2

void __thiscall
CT::MemContourTracing
          (CT *this,MemMat<unsigned_char> *img,MemMat<int> *img_labels,int x,int y,int i_label,
          bool b_external)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int *piVar4;
  Point2i PVar5;
  undefined1 auVar6 [16];
  bool b_isolated;
  int i_previous_contour_point;
  Point2i s;
  undefined1 local_50 [12];
  uint local_44;
  int local_40;
  int local_3c;
  int local_38;
  int iStack_34;
  
  local_38 = x;
  iStack_34 = y;
  piVar4 = MemMat<int>::operator()(img_labels,y,x);
  *piVar4 = i_label;
  local_44 = b_external ^ 7;
  MemTracer((CT *)local_50,(MemMat<unsigned_char> *)this,(MemMat<int> *)img,(Point2i *)img_labels,
            &stack0xffffffffffffffc8,(bool *)&local_44);
  uVar2 = local_50._4_4_;
  uVar1 = local_50._0_4_;
  do {
    do {
      piVar4 = MemMat<int>::operator()(img_labels,local_50._4_4_,local_50._0_4_);
      *piVar4 = i_label;
      PVar5 = MemTracer((CT *)&stack0xffffffffffffffc0,(MemMat<unsigned_char> *)this,
                        (MemMat<int> *)img,(Point2i *)img_labels,(int *)local_50,(bool *)&local_44);
      auVar6._4_4_ = -(uint)(local_38 == local_50._0_4_);
      auVar6._0_4_ = -(uint)(local_38 == local_50._0_4_);
      auVar6._8_4_ = -(uint)(iStack_34 == local_50._4_4_);
      auVar6._12_4_ = -(uint)(iStack_34 == local_50._4_4_);
      iVar3 = movmskpd(PVar5.x,auVar6);
      local_50._4_4_ = local_3c;
      local_50._0_4_ = local_40;
    } while (iVar3 != 3);
  } while (local_3c != uVar2 || local_40 != uVar1);
  return;
}

Assistant:

void MemContourTracing(MemMat<unsigned char> &img, MemMat<int> &img_labels, int x, int y, int i_label, bool b_external) {
        cv::Point2i s(x, y), T, crd_next_point, crd_cur_point;

        // The current point is labeled 
        img_labels(s.y, s.x) = i_label;

        bool b_isolated(false);
        int i_previous_contour_point;
        if (b_external)
            i_previous_contour_point = 6;
        else
            i_previous_contour_point = 7;

        // First call to Tracer
        crd_next_point = T = MemTracer(img, img_labels, s, i_previous_contour_point, b_isolated);
        if (b_isolated)
            return;

        do {
            crd_cur_point = crd_next_point;
            img_labels(crd_cur_point.y, crd_cur_point.x) = i_label;
            crd_next_point = MemTracer(img, img_labels, crd_cur_point, i_previous_contour_point, b_isolated);
        } while (!(crd_cur_point == s && crd_next_point == T));
    }